

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O2

void __thiscall
entityx::ComponentHelper<Test>::copy_component_to
          (ComponentHelper<Test> *this,Entity source,Entity target)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  Family FVar4;
  Pool<Test,_8192UL> *pPVar5;
  EntityManager *this_00;
  EntityManager *pEVar6;
  EntityManager *pEVar7;
  ulong uVar8;
  Id IVar9;
  EntityManager *pEVar10;
  Entity local_50;
  ComponentHandle<Test,_entityx::EntityManager> component;
  
  IVar9 = target.id_.id_;
  this_00 = target.manager_;
  pEVar7 = source.manager_;
  FVar4 = EntityManager::component_family<____C_A_T_C_H____T_E_S_T____56()::Test>();
  pEVar6 = (EntityManager *)0x0;
  pEVar10 = (EntityManager *)0x0;
  if (FVar4 < (ulong)(*(long *)(pEVar7 + 0x20) - *(long *)(pEVar7 + 0x18) >> 3)) {
    if (*(long *)(*(long *)(pEVar7 + 0x18) + FVar4 * 8) == 0) {
      pEVar6 = (EntityManager *)0x0;
      pEVar10 = (EntityManager *)0x0;
    }
    else {
      pEVar10 = (EntityManager *)(source.id_.id_.id_ & 0xffffffff);
      pEVar6 = pEVar7;
      if ((*(ulong *)(*(long *)(pEVar7 + 0x48) + (long)pEVar10 * 8) >> (FVar4 & 0x3f) & 1) == 0) {
        pEVar6 = (EntityManager *)0x0;
        pEVar10 = (EntityManager *)0x0;
      }
    }
  }
  FVar4 = EntityManager::component_family<____C_A_T_C_H____T_E_S_T____56()::Test>();
  lVar1 = *(long *)(*(long *)(pEVar6 + 0x18) + FVar4 * 8);
  uVar2 = *(ulong *)(lVar1 + 0x28);
  lVar3 = *(long *)(*(long *)(lVar1 + 8) + ((ulong)pEVar10 / uVar2) * 8);
  lVar1 = *(long *)(lVar1 + 0x20);
  FVar4 = EntityManager::component_family<____C_A_T_C_H____T_E_S_T____56()::Test>();
  pPVar5 = EntityManager::accomodate_component<____C_A_T_C_H____T_E_S_T____56()::Test>(this_00);
  uVar8 = IVar9.id_ & 0xffffffff;
  *(undefined8 *)
   (*(long *)(*(long *)&pPVar5->field_0x8 + (uVar8 / *(ulong *)&pPVar5->field_0x28) * 8) +
   (uVar8 % *(ulong *)&pPVar5->field_0x28) * *(long *)&pPVar5->field_0x20) =
       *(undefined8 *)(lVar3 + ((ulong)pEVar10 % uVar2) * lVar1);
  Catch::clara::std::bitset<64UL>::set
            ((bitset<64UL> *)(uVar8 * 8 + *(long *)(this_00 + 0x48)),FVar4,true);
  local_50.manager_ = this_00;
  local_50.id_.id_ = IVar9.id_;
  component.manager_ = this_00;
  component.id_.id_ = IVar9.id_;
  EventManager::
  emit<entityx::ComponentAddedEvent<____C_A_T_C_H____T_E_S_T____56()::Test>,entityx::Entity,entityx::ComponentHandle<____C_A_T_C_H____T_E_S_T____56()::Test,entityx::EntityManager>&>
            (*(EventManager **)(this_00 + 0x10),&local_50,&component);
  return;
}

Assistant:

void copy_component_to(Entity source, Entity target) override {
    target.assign_from_copy<C>(*(source.component<C>().get()));
  }